

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderGLImpl::ShaderBuilder::HandleCompilingState
          (ShaderBuilder *this,bool WaitForCompletion)

{
  bool bVar1;
  char (*in_RCX) [28];
  GLint CompilationComplete;
  string msg;
  
  if (this->m_State != Compiling) {
    FormatString<char[26],char[28]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::Compiling",in_RCX);
    in_RCX = (char (*) [28])0x66;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"HandleCompilingState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x66);
    std::__cxx11::string::~string((string *)&msg);
  }
  CompilationComplete = 0;
  if (WaitForCompletion) {
    CompilationComplete = 1;
  }
  else {
    if (this->m_CreateAsynchronously == false) {
      FormatString<char[26],char[23]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_CreateAsynchronously",(char (*) [23])in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"HandleCompilingState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x6b);
      std::__cxx11::string::~string((string *)&msg);
    }
    (*__glewGetShaderiv)((this->m_Shader->m_GLShaderObj).m_uiHandle,0x91b1,&CompilationComplete);
    if (CompilationComplete == 0) {
      return;
    }
  }
  bVar1 = GetCompileStatus(this->m_Shader,this->m_ppCompilerOutput,
                           (bool)(this->m_CreateAsynchronously ^ 1));
  this->m_State = (uint)!bVar1 * 2 + Linking;
  return;
}

Assistant:

void HandleCompilingState(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::Compiling);

        GLint CompilationComplete = GL_FALSE;
        if (!WaitForCompletion)
        {
            VERIFY_EXPR(m_CreateAsynchronously);
            glGetShaderiv(m_Shader.m_GLShaderObj, GL_COMPLETION_STATUS_KHR, &CompilationComplete);
        }
        else
        {
            CompilationComplete = GL_TRUE;
        }

        if (CompilationComplete)
        {
            m_State = m_Shader.GetCompileStatus(m_ppCompilerOutput, /*ThrowOnError = */ !m_CreateAsynchronously) ? State::Linking : State::Failed;
        }
    }